

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtiming.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Am_Wrapper *pAVar5;
  Am_Object *pAVar6;
  Am_Object AVar7;
  Am_Value *this;
  long lVar8;
  ostream *poVar9;
  int iVar10;
  Am_Time stop;
  Am_Object linear;
  Am_Object stepper;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Time local_38 [8];
  Am_Object local_30;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  iVar2 = 1000;
  if (1 < argc) {
    iVar2 = atoi(argv[1]);
  }
  uVar3 = 0x32;
  if (2 < argc) {
    uVar3 = atoi(argv[2]);
  }
  Am_Initialize();
  Am_Object::Create((char *)&local_50);
  Am_Time::Am_Time((Am_Time *)&local_60);
  pAVar5 = Am_Time::operator_cast_to_Am_Wrapper_((Am_Time *)&local_60);
  uVar1 = Am_Object::Set((ushort)&local_50,(Am_Wrapper *)0xe9,(ulong)pAVar5);
  uVar1 = Am_Object::Set(uVar1,0x183,1);
  pAVar6 = (Am_Object *)
           Am_Object::Set(uVar1,(Am_Method_Wrapper *)0xca,(ulong)print_elapsed_time.from_wrapper);
  Am_Object::Am_Object(&local_30,pAVar6);
  Am_Time::~Am_Time((Am_Time *)&local_60);
  Am_Object::~Am_Object(&local_50);
  Am_Object::Create((char *)&local_60);
  Am_Time::Am_Time((Am_Time *)&local_58);
  pAVar5 = Am_Time::operator_cast_to_Am_Wrapper_((Am_Time *)&local_58);
  uVar1 = Am_Object::Set((ushort)&local_60,(Am_Wrapper *)0x101,(ulong)pAVar5);
  Am_Time::Am_Time(local_38,10000);
  pAVar5 = Am_Time::operator_cast_to_Am_Wrapper_(local_38);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0xfd,(ulong)pAVar5);
  pAVar6 = (Am_Object *)
           Am_Object::Set(uVar1,(Am_Method_Wrapper *)0xca,(ulong)print_event_count.from_wrapper);
  Am_Object::Am_Object(&local_50,pAVar6);
  Am_Time::~Am_Time(local_38);
  Am_Time::~Am_Time((Am_Time *)&local_58);
  Am_Object::~Am_Object(&local_60);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Starting test animation...",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  std::ostream::flush();
  Am_Object::Create((char *)&local_60);
  uVar1 = Am_Object::Set((ushort)&local_60,0x66,100);
  AVar7.data = (Am_Object_Data *)Am_Object::Set(uVar1,0x67,100);
  Am_Object::Create((char *)&local_58);
  uVar1 = Am_Object::Set((ushort)&local_58,0x66,(ulong)uVar3);
  uVar1 = Am_Object::Set(uVar1,0x67,(ulong)uVar3);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar1,100,0);
  pAVar6 = (Am_Object *)Am_Object::operator=(&goober,pAVar6);
  Am_Object::Am_Object(&local_48,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(AVar7,SUB81(&local_48,0),1);
  Am_Object::Am_Object(&local_40,pAVar6);
  Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_40,0),1);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&local_60);
  Am_Time::Now();
  Am_Time::operator=((Am_Time *)&start,(Am_Time *)&local_60);
  Am_Time::~Am_Time((Am_Time *)&local_60);
  if (0 < iVar2) {
    iVar10 = iVar2;
    do {
      this = (Am_Value *)Am_Object::Get(0x5248,100);
      iVar4 = Am_Value::operator_cast_to_int(this);
      Am_Object::Set(0x5248,100,(ulong)(uint)((int)uVar3 / 2 - iVar4));
      Am_Demon_Queue::Invoke();
      Am_Update_All();
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
  }
  Am_Time::Now();
  Am_Time::operator-((Am_Time *)&local_58,(Am_Time *)&local_60);
  lVar8 = Am_Time::Milliseconds();
  Am_Time::~Am_Time((Am_Time *)&local_58);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Redraw executed ",0x10);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," steps in ",10);
  poVar9 = std::ostream::_M_insert<long>((long)poVar9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  poVar9 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"for average cost of ",0x14);
  poVar9 = std::ostream::_M_insert<double>((double)lVar8 / (double)iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," ms per iteration.",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Done.",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  std::ostream::flush();
  Am_Cleanup();
  Am_Time::~Am_Time((Am_Time *)&local_60);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_30);
  return 0;
}

Assistant:

int
main(int argc, char *argv[])
{
  std::cout << "Test" << std::endl;

  int n = argc > 1 ? atoi(argv[1]) : 1000;
  int size = argc > 2 ? atoi(argv[2]) : 50;
  //  bool use_linear = (argc > 2);

  Am_Initialize();

  Am_Object stepper = Am_Stepping_Animator.Create("stepper")
                          .Set(Am_REPEAT_DELAY, Am_Time())
                          .Set(Am_SMALL_INCREMENT, 1)
                          .Set(Am_DO_METHOD, print_elapsed_time);
  Am_Object linear = Am_Animator.Create("linear")
                         .Set(Am_MIN_REPEAT_DELAY, Am_Time())
                         .Set(Am_DURATION, Am_Time(10000))
                         .Set(Am_DO_METHOD, print_event_count);

  std::cout << "Starting test animation..." << std::endl << std::flush;
  Am_Screen.Add_Part(Am_Window.Create()
                         .Set(Am_WIDTH, 100)
                         .Set(Am_HEIGHT, 100)
                         .Add_Part(goober = Am_Rectangle.Create()
                                                .Set(Am_WIDTH, size)
                                                .Set(Am_HEIGHT, size)
                                                .Set(Am_LEFT, 0)));

  start = Am_Time::Now();

  for (int i = 0; i < n; ++i) {
    goober.Set(Am_LEFT, size / 2 - (int)goober.Get(Am_LEFT));
    Main_Demon_Queue.Invoke();
    Am_Update_All();
  }

  Am_Time stop = Am_Time::Now();

  long ms = (stop - start).Milliseconds();

  std::cout << "Redraw executed " << n << " steps in " << ms << std::endl
            << "for average cost of " << double(ms) / n << " ms per iteration."
            << std::endl
            << std::flush;

  std::cout << "Done." << std::endl << std::flush;
  Am_Cleanup();

  return 0;
}